

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

unsigned_long_long QUtil::string_to_ull(char *str)

{
  byte bVar1;
  byte *pbVar2;
  int *piVar3;
  ulonglong uVar4;
  runtime_error *prVar5;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pbVar2 = (byte *)str;
  while( true ) {
    bVar1 = *pbVar2;
    if ((4 < bVar1 - 9) && (bVar1 != 0x20)) break;
    pbVar2 = pbVar2 + 1;
  }
  if (bVar1 != 0x2d) {
    piVar3 = __errno_location();
    *piVar3 = 0;
    uVar4 = strtoull(str,(char **)0x0,10);
    if (*piVar3 != 0x22) {
      return uVar4;
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"overflow converting ",&local_79);
    std::operator+(&local_58,&local_78,str);
    std::operator+(&local_38,&local_58," to 64-bit unsigned integer");
    std::runtime_error::runtime_error(prVar5,(string *)&local_38);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"underflow converting ",&local_79);
  std::operator+(&local_58,&local_78,str);
  std::operator+(&local_38,&local_58," to 64-bit unsigned integer");
  std::runtime_error::runtime_error(prVar5,(string *)&local_38);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unsigned long long
QUtil::string_to_ull(char const* str)
{
    char const* p = str;
    while (*p && util::is_space(*p)) {
        ++p;
    }
    if (*p == '-') {
        throw std::runtime_error(
            std::string("underflow converting ") + str + " to 64-bit unsigned integer");
    }

    errno = 0;
#ifdef _MSC_VER
    unsigned long long result = _strtoui64(str, 0, 10);
#else
    unsigned long long result = strtoull(str, nullptr, 10);
#endif
    if (errno == ERANGE) {
        throw std::runtime_error(
            std::string("overflow converting ") + str + " to 64-bit unsigned integer");
    }
    return result;
}